

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrLDX0xbe(CPU *this)

{
  uint8_t uVar1;
  byte bVar2;
  
  uVar1 = absolute_y_addr(this);
  this->X = uVar1;
  if (uVar1 == '\0') {
    bVar2 = this->field_0x2e | 0x40;
  }
  else {
    bVar2 = this->field_0x2e & 0xbf;
    if ((char)uVar1 < '\0') {
      bVar2 = bVar2 | 1;
      goto LAB_0010ec5f;
    }
  }
  bVar2 = bVar2 & 0xfe;
LAB_0010ec5f:
  this->field_0x2e = bVar2;
  return 4;
}

Assistant:

int CPU::instrLDX0xbe() {
	LDX(absolute_y_addr());
	return 4;
}